

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_reset_compressedBlockState(ZSTD_compressedBlockState_t *bs)

{
  bs->rep[0] = 1;
  bs->rep[1] = 4;
  bs->rep[2] = 8;
  (bs->entropy).huf.repeatMode = HUF_repeat_none;
  (bs->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (bs->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  return;
}

Assistant:

void ZSTD_reset_compressedBlockState(ZSTD_compressedBlockState_t* bs)
{
    int i;
    for (i = 0; i < ZSTD_REP_NUM; ++i)
        bs->rep[i] = repStartValue[i];
    bs->entropy.huf.repeatMode = HUF_repeat_none;
    bs->entropy.fse.offcode_repeatMode = FSE_repeat_none;
    bs->entropy.fse.matchlength_repeatMode = FSE_repeat_none;
    bs->entropy.fse.litlength_repeatMode = FSE_repeat_none;
}